

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O1

GridNode * __thiscall Grid::get_start_node(Grid *this)

{
  uint uVar1;
  GridNode *pGVar2;
  bool bVar3;
  GridNode *pGVar4;
  ulong uVar5;
  GridNode *pGVar6;
  GridNode *in_RAX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  GridNode *pGVar11;
  GridNode *pGVar12;
  bool bVar13;
  
  uVar7 = (ulong)this->rows;
  bVar13 = 0 < (long)uVar7;
  if (0 < (long)uVar7) {
    uVar1 = this->columns;
    lVar10 = (long)(int)uVar1;
    pGVar2 = this->nodes;
    in_RAX = (GridNode *)(lVar10 * 8);
    uVar8 = 0;
    pGVar12 = pGVar2;
    do {
      bVar3 = 0 < lVar10;
      if (0 < (int)uVar1) {
        if (pGVar2[uVar8 * lVar10].state == ORIGIN) {
          in_RAX = pGVar2 + uVar8 * lVar10;
        }
        else {
          uVar5 = 1;
          pGVar11 = pGVar12;
          do {
            uVar9 = uVar5;
            pGVar6 = in_RAX;
            if (uVar1 == uVar9) break;
            pGVar6 = pGVar11 + 1;
            pGVar4 = pGVar11 + 1;
            uVar5 = uVar9 + 1;
            pGVar11 = pGVar6;
          } while (pGVar4->state != ORIGIN);
          in_RAX = pGVar6;
          bVar3 = (long)uVar9 < lVar10;
        }
      }
      if (bVar3) break;
      uVar8 = uVar8 + 1;
      bVar13 = uVar8 < uVar7;
      pGVar12 = pGVar12 + lVar10;
    } while (uVar8 != uVar7);
  }
  if (!bVar13) {
    in_RAX = this->nodes;
  }
  return in_RAX;
}

Assistant:

GridNode *get_start_node()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                if (get_node_from_position(x, y)->state == ORIGIN)
                {
                    return get_node_from_position(x, y);
                }
            }
        }
        return get_node_from_position(0, 0);
    }